

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<sisl::cartesian_cubic<float>*const&>::
captureExpression<(Catch::Internal::Operator)1,long>
          (ExpressionLhs<sisl::cartesian_cubic<float>*const&> *this,long *rhs)

{
  StringMaker<sisl::cartesian_cubic<float>*> *this_00;
  undefined4 uVar1;
  cartesian_cubic<float> *in_RDX;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  this_00 = (StringMaker<sisl::cartesian_cubic<float>*> *)**(undefined8 **)(this + 0x228);
  uVar1 = 0x11;
  if (this_00 != (StringMaker<sisl::cartesian_cubic<float>*> *)*rhs) {
    uVar1 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar1;
  StringMaker<sisl::cartesian_cubic<float>*>::convert<sisl::cartesian_cubic<float>>
            (&local_38,this_00,in_RDX);
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  Detail::StringMakerBase<true>::convert<long>(&local_58,rhs);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"!=","");
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }